

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O1

bool embree::avx::OrientedDiscMiIntersectorK<8,_8,_true>::occluded
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *Disc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined4 uVar7;
  Scene *pSVar8;
  Geometry *pGVar9;
  long lVar10;
  __int_type_conflict _Var11;
  RTCFilterFunctionN p_Var12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  uint uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  undefined8 *puVar37;
  ulong uVar38;
  ulong uVar39;
  undefined4 uVar40;
  ulong uVar41;
  long lVar42;
  ulong uVar43;
  ulong uVar44;
  bool bVar45;
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [64];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [64];
  undefined1 auVar65 [32];
  undefined1 auVar66 [64];
  undefined4 uVar67;
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  Primitive *local_308;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  RTCFilterFunctionNArguments local_290;
  undefined1 local_260 [16];
  undefined1 local_250 [16];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined4 local_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  
  pSVar8 = context->scene;
  uVar34 = (ulong)(Disc->primIDs).field_0.i[0];
  pGVar9 = (pSVar8->geometries).items[Disc->sharedGeomID].ptr;
  lVar10 = *(long *)&pGVar9->field_0x58;
  _Var11 = pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  uVar39 = (ulong)(Disc->primIDs).field_0.i[1];
  uVar36 = (ulong)(Disc->primIDs).field_0.i[4];
  auVar46._16_16_ = *(undefined1 (*) [16])(lVar10 + _Var11 * uVar36);
  auVar46._0_16_ = *(undefined1 (*) [16])(lVar10 + _Var11 * uVar34);
  uVar38 = (ulong)(Disc->primIDs).field_0.i[5];
  auVar49._16_16_ = *(undefined1 (*) [16])(lVar10 + _Var11 * uVar38);
  auVar49._0_16_ = *(undefined1 (*) [16])(lVar10 + _Var11 * uVar39);
  uVar43 = (ulong)(Disc->primIDs).field_0.i[2];
  uVar41 = (ulong)(Disc->primIDs).field_0.i[3];
  uVar35 = (ulong)(Disc->primIDs).field_0.i[6];
  auVar51._16_16_ = *(undefined1 (*) [16])(lVar10 + _Var11 * uVar35);
  auVar51._0_16_ = *(undefined1 (*) [16])(lVar10 + _Var11 * uVar43);
  uVar44 = (ulong)(Disc->primIDs).field_0.i[7];
  auVar52._16_16_ = *(undefined1 (*) [16])(lVar10 + _Var11 * uVar44);
  auVar52._0_16_ = *(undefined1 (*) [16])(lVar10 + _Var11 * uVar41);
  lVar10 = *(long *)&pGVar9[1].time_range.upper;
  p_Var12 = pGVar9[1].intersectionFilterN;
  lVar42 = uVar41 * (long)p_Var12;
  auVar62._16_16_ = *(undefined1 (*) [16])(lVar10 + uVar36 * (long)p_Var12);
  auVar62._0_16_ = *(undefined1 (*) [16])(lVar10 + uVar34 * (long)p_Var12);
  auVar65._16_16_ = *(undefined1 (*) [16])(lVar10 + uVar38 * (long)p_Var12);
  auVar65._0_16_ = *(undefined1 (*) [16])(lVar10 + uVar39 * (long)p_Var12);
  auVar68._16_16_ = *(undefined1 (*) [16])(lVar10 + uVar35 * (long)p_Var12);
  auVar68._0_16_ = *(undefined1 (*) [16])(lVar10 + uVar43 * (long)p_Var12);
  auVar69._16_16_ = *(undefined1 (*) [16])(lVar10 + (long)p_Var12 * uVar44);
  auVar69._0_16_ = *(undefined1 (*) [16])(lVar10 + lVar42);
  auVar54 = vunpcklps_avx(auVar46,auVar51);
  auVar22 = vunpckhps_avx(auVar46,auVar51);
  auVar46 = vunpcklps_avx(auVar49,auVar52);
  auVar58 = vunpckhps_avx(auVar49,auVar52);
  auVar47 = vunpcklps_avx(auVar54,auVar46);
  local_2c0 = vunpckhps_avx(auVar54,auVar46);
  local_2e0 = vunpcklps_avx(auVar22,auVar58);
  auVar49 = vunpcklps_avx(auVar62,auVar68);
  auVar54 = vunpckhps_avx(auVar62,auVar68);
  auVar51 = vunpcklps_avx(auVar65,auVar69);
  auVar46 = vunpckhps_avx(auVar65,auVar69);
  auVar62 = vunpcklps_avx(auVar54,auVar46);
  local_1e0 = vunpcklps_avx(auVar49,auVar51);
  local_1c0 = vunpckhps_avx(auVar49,auVar51);
  local_250 = vpshufd_avx(ZEXT416(Disc->sharedGeomID),0);
  local_260 = local_250;
  fVar1 = *(float *)(ray + k * 4 + 0x20);
  auVar63._4_4_ = fVar1;
  auVar63._0_4_ = fVar1;
  auVar63._8_4_ = fVar1;
  auVar63._12_4_ = fVar1;
  auVar63._16_4_ = fVar1;
  auVar63._20_4_ = fVar1;
  auVar63._24_4_ = fVar1;
  auVar63._28_4_ = fVar1;
  fVar2 = *(float *)(ray + k * 4 + 0x80);
  fVar3 = *(float *)(ray + k * 4 + 0xa0);
  fVar4 = *(float *)(ray + k * 4 + 0xc0);
  auVar53._0_4_ = fVar2 * local_1e0._0_4_ + fVar3 * local_1c0._0_4_ + fVar4 * auVar62._0_4_;
  auVar53._4_4_ = fVar2 * local_1e0._4_4_ + fVar3 * local_1c0._4_4_ + fVar4 * auVar62._4_4_;
  auVar53._8_4_ = fVar2 * local_1e0._8_4_ + fVar3 * local_1c0._8_4_ + fVar4 * auVar62._8_4_;
  auVar53._12_4_ = fVar2 * local_1e0._12_4_ + fVar3 * local_1c0._12_4_ + fVar4 * auVar62._12_4_;
  auVar53._16_4_ = fVar2 * local_1e0._16_4_ + fVar3 * local_1c0._16_4_ + fVar4 * auVar62._16_4_;
  auVar53._20_4_ = fVar2 * local_1e0._20_4_ + fVar3 * local_1c0._20_4_ + fVar4 * auVar62._20_4_;
  auVar53._24_4_ = fVar2 * local_1e0._24_4_ + fVar3 * local_1c0._24_4_ + fVar4 * auVar62._24_4_;
  auVar53._28_4_ = 0;
  auVar46 = vcmpps_avx(ZEXT432(0) << 0x20,auVar53,0);
  auVar21 = vpshufd_avx(ZEXT116(Disc->numPrimitives),0);
  auVar70._16_16_ = auVar21;
  auVar70._0_16_ = auVar21;
  auVar54 = vcvtdq2ps_avx(auVar70);
  auVar49 = vcmpps_avx(_DAT_02020f40,auVar54,1);
  auVar71._8_4_ = 0x3f800000;
  auVar71._0_8_ = &DAT_3f8000003f800000;
  auVar71._12_4_ = 0x3f800000;
  auVar71._16_4_ = 0x3f800000;
  auVar71._20_4_ = 0x3f800000;
  auVar71._24_4_ = 0x3f800000;
  auVar71._28_4_ = 0x3f800000;
  auVar54 = vblendvps_avx(auVar53,auVar71,auVar46);
  fVar5 = *(float *)(ray + k * 4 + 0x40);
  auVar72._4_4_ = fVar5;
  auVar72._0_4_ = fVar5;
  auVar72._8_4_ = fVar5;
  auVar72._12_4_ = fVar5;
  auVar72._16_4_ = fVar5;
  auVar72._20_4_ = fVar5;
  auVar72._24_4_ = fVar5;
  auVar72._28_4_ = fVar5;
  auVar46 = vandnps_avx(auVar46,auVar49);
  auVar49 = vsubps_avx(local_2e0,auVar72);
  auVar51 = vsubps_avx(local_2c0,auVar63);
  fVar6 = *(float *)(ray + k * 4);
  auVar73._4_4_ = fVar6;
  auVar73._0_4_ = fVar6;
  auVar73._8_4_ = fVar6;
  auVar73._12_4_ = fVar6;
  auVar73._16_4_ = fVar6;
  auVar73._20_4_ = fVar6;
  auVar73._24_4_ = fVar6;
  auVar73._28_4_ = fVar6;
  auVar52 = vsubps_avx(auVar47,auVar73);
  auVar55._0_4_ =
       auVar51._0_4_ * local_1c0._0_4_ + auVar49._0_4_ * auVar62._0_4_ +
       local_1e0._0_4_ * auVar52._0_4_;
  auVar55._4_4_ =
       auVar51._4_4_ * local_1c0._4_4_ + auVar49._4_4_ * auVar62._4_4_ +
       local_1e0._4_4_ * auVar52._4_4_;
  auVar55._8_4_ =
       auVar51._8_4_ * local_1c0._8_4_ + auVar49._8_4_ * auVar62._8_4_ +
       local_1e0._8_4_ * auVar52._8_4_;
  auVar55._12_4_ =
       auVar51._12_4_ * local_1c0._12_4_ + auVar49._12_4_ * auVar62._12_4_ +
       local_1e0._12_4_ * auVar52._12_4_;
  auVar55._16_4_ =
       auVar51._16_4_ * local_1c0._16_4_ + auVar49._16_4_ * auVar62._16_4_ +
       local_1e0._16_4_ * auVar52._16_4_;
  auVar55._20_4_ =
       auVar51._20_4_ * local_1c0._20_4_ + auVar49._20_4_ * auVar62._20_4_ +
       local_1e0._20_4_ * auVar52._20_4_;
  auVar55._24_4_ =
       auVar51._24_4_ * local_1c0._24_4_ + auVar49._24_4_ * auVar62._24_4_ +
       local_1e0._24_4_ * auVar52._24_4_;
  auVar55._28_4_ = auVar51._28_4_ + auVar49._28_4_ + auVar52._28_4_;
  local_200 = vdivps_avx(auVar55,auVar54);
  uVar40 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar54._4_4_ = uVar40;
  auVar54._0_4_ = uVar40;
  auVar54._8_4_ = uVar40;
  auVar54._12_4_ = uVar40;
  auVar54._16_4_ = uVar40;
  auVar54._20_4_ = uVar40;
  auVar54._24_4_ = uVar40;
  auVar54._28_4_ = uVar40;
  uVar40 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar56._4_4_ = uVar40;
  auVar56._0_4_ = uVar40;
  auVar56._8_4_ = uVar40;
  auVar56._12_4_ = uVar40;
  auVar56._16_4_ = uVar40;
  auVar56._20_4_ = uVar40;
  auVar56._24_4_ = uVar40;
  auVar56._28_4_ = uVar40;
  auVar54 = vcmpps_avx(auVar54,local_200,2);
  auVar49 = vcmpps_avx(local_200,auVar56,2);
  auVar54 = vandps_avx(auVar54,auVar49);
  auVar51 = auVar46 & auVar54;
  if ((((((((auVar51 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar51 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar51 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar51 >> 0x7f,0) != '\0') ||
        (auVar51 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar51 >> 0xbf,0) != '\0') ||
      (auVar51 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar51[0x1f] < '\0') {
    auVar54 = vandps_avx(auVar46,auVar54);
    auVar52 = vunpckhps_avx(auVar22,auVar58);
    fVar13 = local_200._0_4_;
    fVar14 = local_200._4_4_;
    fVar15 = local_200._8_4_;
    fVar16 = local_200._12_4_;
    fVar17 = local_200._16_4_;
    fVar18 = local_200._20_4_;
    fVar19 = local_200._24_4_;
    auVar57._0_4_ = fVar6 + fVar2 * fVar13;
    auVar57._4_4_ = fVar6 + fVar2 * fVar14;
    auVar57._8_4_ = fVar6 + fVar2 * fVar15;
    auVar57._12_4_ = fVar6 + fVar2 * fVar16;
    auVar57._16_4_ = fVar6 + fVar2 * fVar17;
    auVar57._20_4_ = fVar6 + fVar2 * fVar18;
    auVar57._24_4_ = fVar6 + fVar2 * fVar19;
    auVar57._28_4_ = fVar6 + auVar49._28_4_;
    auVar59._0_4_ = fVar1 + fVar3 * fVar13;
    auVar59._4_4_ = fVar1 + fVar3 * fVar14;
    auVar59._8_4_ = fVar1 + fVar3 * fVar15;
    auVar59._12_4_ = fVar1 + fVar3 * fVar16;
    auVar59._16_4_ = fVar1 + fVar3 * fVar17;
    auVar59._20_4_ = fVar1 + fVar3 * fVar18;
    auVar59._24_4_ = fVar1 + fVar3 * fVar19;
    auVar59._28_4_ = fVar1 + auVar22._28_4_;
    auVar60._0_4_ = fVar5 + fVar4 * fVar13;
    auVar60._4_4_ = fVar5 + fVar4 * fVar14;
    auVar60._8_4_ = fVar5 + fVar4 * fVar15;
    auVar60._12_4_ = fVar5 + fVar4 * fVar16;
    auVar60._16_4_ = fVar5 + fVar4 * fVar17;
    auVar60._20_4_ = fVar5 + fVar4 * fVar18;
    auVar60._24_4_ = fVar5 + fVar4 * fVar19;
    auVar60._28_4_ = fVar5 + auVar58._28_4_;
    auVar46 = vsubps_avx(auVar57,auVar47);
    auVar49 = vsubps_avx(auVar59,local_2c0);
    auVar51 = vsubps_avx(auVar60,local_2e0);
    auVar58._0_4_ =
         auVar46._0_4_ * auVar46._0_4_ +
         auVar49._0_4_ * auVar49._0_4_ + auVar51._0_4_ * auVar51._0_4_;
    auVar58._4_4_ =
         auVar46._4_4_ * auVar46._4_4_ +
         auVar49._4_4_ * auVar49._4_4_ + auVar51._4_4_ * auVar51._4_4_;
    auVar58._8_4_ =
         auVar46._8_4_ * auVar46._8_4_ +
         auVar49._8_4_ * auVar49._8_4_ + auVar51._8_4_ * auVar51._8_4_;
    auVar58._12_4_ =
         auVar46._12_4_ * auVar46._12_4_ +
         auVar49._12_4_ * auVar49._12_4_ + auVar51._12_4_ * auVar51._12_4_;
    auVar58._16_4_ =
         auVar46._16_4_ * auVar46._16_4_ +
         auVar49._16_4_ * auVar49._16_4_ + auVar51._16_4_ * auVar51._16_4_;
    auVar58._20_4_ =
         auVar46._20_4_ * auVar46._20_4_ +
         auVar49._20_4_ * auVar49._20_4_ + auVar51._20_4_ * auVar51._20_4_;
    auVar58._24_4_ =
         auVar46._24_4_ * auVar46._24_4_ +
         auVar49._24_4_ * auVar49._24_4_ + auVar51._24_4_ * auVar51._24_4_;
    auVar58._28_4_ = auVar46._28_4_ + auVar49._28_4_ + auVar51._28_4_;
    auVar22._4_4_ = auVar52._4_4_ * auVar52._4_4_;
    auVar22._0_4_ = auVar52._0_4_ * auVar52._0_4_;
    auVar22._8_4_ = auVar52._8_4_ * auVar52._8_4_;
    auVar22._12_4_ = auVar52._12_4_ * auVar52._12_4_;
    auVar22._16_4_ = auVar52._16_4_ * auVar52._16_4_;
    auVar22._20_4_ = auVar52._20_4_ * auVar52._20_4_;
    auVar22._24_4_ = auVar52._24_4_ * auVar52._24_4_;
    auVar22._28_4_ = auVar52._28_4_;
    auVar46 = vcmpps_avx(auVar58,auVar22,1);
    auVar49 = auVar54 & auVar46;
    if ((((((((auVar49 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar49 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar49 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar49 >> 0x7f,0) != '\0') ||
          (auVar49 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar49 >> 0xbf,0) != '\0') ||
        (auVar49 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar49[0x1f] < '\0')
    {
      auVar54 = vandps_avx(auVar54,auVar46);
      auVar61 = ZEXT1264(ZEXT412(0)) << 0x20;
      local_220 = ZEXT1232(ZEXT412(0)) << 0x20;
      local_240 = local_220;
      local_300._0_8_ = auVar62._0_8_;
      local_300._8_8_ = auVar62._8_8_;
      local_300._16_8_ = auVar62._16_8_;
      local_300._24_8_ = auVar62._24_8_;
      local_1a0 = local_300._0_8_;
      uStack_198 = local_300._8_8_;
      uStack_190 = local_300._16_8_;
      uStack_188 = local_300._24_8_;
      uVar40 = vmovmskps_avx(auVar54);
      uVar43 = CONCAT44((int)((ulong)lVar42 >> 0x20),uVar40);
      uVar33 = 1 << ((byte)k & 0x1f);
      uVar34 = (ulong)((uVar33 & 0xf) << 4);
      puVar37 = (undefined8 *)(mm_lookupmask_ps + (long)((int)uVar33 >> 4) * 0x10);
      auVar64 = ZEXT464(0) << 0x20;
      auVar66 = ZEXT3264(CONCAT428(0xff800000,
                                   CONCAT424(0xff800000,
                                             CONCAT420(0xff800000,
                                                       CONCAT416(0xff800000,
                                                                 CONCAT412(0xff800000,
                                                                           CONCAT48(0xff800000,
                                                                                                                                                                        
                                                  0xff800000ff800000)))))));
      local_308 = Disc;
      do {
        local_290.hit = local_180;
        local_290.valid = (int *)&local_340;
        uVar35 = 0;
        if (uVar43 != 0) {
          for (; (uVar43 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
          }
        }
        uVar33 = *(uint *)(local_260 + uVar35 * 4);
        pGVar9 = (pSVar8->geometries).items[uVar33].ptr;
        if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
          uVar43 = uVar43 ^ 1L << (uVar35 & 0x3f);
          bVar45 = true;
        }
        else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                (pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
          bVar45 = false;
        }
        else {
          uVar67 = *(undefined4 *)(ray + k * 4 + 0x100);
          local_120 = *(undefined4 *)(local_240 + uVar35 * 4);
          local_100 = *(undefined4 *)(local_220 + uVar35 * 4);
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_200 + uVar35 * 4);
          local_290.context = context->user;
          local_b0 = vpshufd_avx(ZEXT416(uVar33),0);
          uVar33 = (local_308->primIDs).field_0.i[uVar35];
          local_e0._4_4_ = uVar33;
          local_e0._0_4_ = uVar33;
          local_e0._8_4_ = uVar33;
          local_e0._12_4_ = uVar33;
          local_e0._16_4_ = uVar33;
          local_e0._20_4_ = uVar33;
          local_e0._24_4_ = uVar33;
          local_e0._28_4_ = uVar33;
          uVar40 = *(undefined4 *)(local_1e0 + uVar35 * 4);
          uVar7 = *(undefined4 *)(local_1c0 + uVar35 * 4);
          local_160._4_4_ = uVar7;
          local_160._0_4_ = uVar7;
          local_160._8_4_ = uVar7;
          local_160._12_4_ = uVar7;
          local_160._16_4_ = uVar7;
          local_160._20_4_ = uVar7;
          local_160._24_4_ = uVar7;
          local_160._28_4_ = uVar7;
          uVar7 = *(undefined4 *)((long)&local_1a0 + uVar35 * 4);
          local_140._4_4_ = uVar7;
          local_140._0_4_ = uVar7;
          local_140._8_4_ = uVar7;
          local_140._12_4_ = uVar7;
          local_140._16_4_ = uVar7;
          local_140._20_4_ = uVar7;
          local_140._24_4_ = uVar7;
          local_140._28_4_ = uVar7;
          local_180[0] = (RTCHitN)(char)uVar40;
          local_180[1] = (RTCHitN)(char)((uint)uVar40 >> 8);
          local_180[2] = (RTCHitN)(char)((uint)uVar40 >> 0x10);
          local_180[3] = (RTCHitN)(char)((uint)uVar40 >> 0x18);
          local_180[4] = (RTCHitN)(char)uVar40;
          local_180[5] = (RTCHitN)(char)((uint)uVar40 >> 8);
          local_180[6] = (RTCHitN)(char)((uint)uVar40 >> 0x10);
          local_180[7] = (RTCHitN)(char)((uint)uVar40 >> 0x18);
          local_180[8] = (RTCHitN)(char)uVar40;
          local_180[9] = (RTCHitN)(char)((uint)uVar40 >> 8);
          local_180[10] = (RTCHitN)(char)((uint)uVar40 >> 0x10);
          local_180[0xb] = (RTCHitN)(char)((uint)uVar40 >> 0x18);
          local_180[0xc] = (RTCHitN)(char)uVar40;
          local_180[0xd] = (RTCHitN)(char)((uint)uVar40 >> 8);
          local_180[0xe] = (RTCHitN)(char)((uint)uVar40 >> 0x10);
          local_180[0xf] = (RTCHitN)(char)((uint)uVar40 >> 0x18);
          local_180[0x10] = (RTCHitN)(char)uVar40;
          local_180[0x11] = (RTCHitN)(char)((uint)uVar40 >> 8);
          local_180[0x12] = (RTCHitN)(char)((uint)uVar40 >> 0x10);
          local_180[0x13] = (RTCHitN)(char)((uint)uVar40 >> 0x18);
          local_180[0x14] = (RTCHitN)(char)uVar40;
          local_180[0x15] = (RTCHitN)(char)((uint)uVar40 >> 8);
          local_180[0x16] = (RTCHitN)(char)((uint)uVar40 >> 0x10);
          local_180[0x17] = (RTCHitN)(char)((uint)uVar40 >> 0x18);
          local_180[0x18] = (RTCHitN)(char)uVar40;
          local_180[0x19] = (RTCHitN)(char)((uint)uVar40 >> 8);
          local_180[0x1a] = (RTCHitN)(char)((uint)uVar40 >> 0x10);
          local_180[0x1b] = (RTCHitN)(char)((uint)uVar40 >> 0x18);
          local_180[0x1c] = (RTCHitN)(char)uVar40;
          local_180[0x1d] = (RTCHitN)(char)((uint)uVar40 >> 8);
          local_180[0x1e] = (RTCHitN)(char)((uint)uVar40 >> 0x10);
          local_180[0x1f] = (RTCHitN)(char)((uint)uVar40 >> 0x18);
          uStack_11c = local_120;
          uStack_118 = local_120;
          uStack_114 = local_120;
          uStack_110 = local_120;
          uStack_10c = local_120;
          uStack_108 = local_120;
          uStack_104 = local_120;
          uStack_fc = local_100;
          uStack_f8 = local_100;
          uStack_f4 = local_100;
          uStack_f0 = local_100;
          uStack_ec = local_100;
          uStack_e8 = local_100;
          uStack_e4 = local_100;
          local_c0 = local_b0;
          local_300 = vcmpps_avx(auVar61._0_32_,auVar61._0_32_,0xf);
          uStack_9c = (local_290.context)->instID[0];
          local_a0 = uStack_9c;
          uStack_98 = uStack_9c;
          uStack_94 = uStack_9c;
          uStack_90 = uStack_9c;
          uStack_8c = uStack_9c;
          uStack_88 = uStack_9c;
          uStack_84 = uStack_9c;
          uStack_7c = (local_290.context)->instPrimID[0];
          local_80 = uStack_7c;
          uStack_78 = uStack_7c;
          uStack_74 = uStack_7c;
          uStack_70 = uStack_7c;
          uStack_6c = uStack_7c;
          uStack_68 = uStack_7c;
          uStack_64 = uStack_7c;
          local_340 = *(undefined8 *)(mm_lookupmask_ps + uVar34);
          uStack_338 = *(undefined8 *)(mm_lookupmask_ps + uVar34 + 8);
          local_330 = *puVar37;
          uStack_328 = puVar37[1];
          local_290.geometryUserPtr = pGVar9->userPtr;
          local_290.N = 8;
          local_290.ray = (RTCRayN *)ray;
          if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            local_2c0._0_8_ = puVar37;
            local_2e0._0_4_ = uVar67;
            (*pGVar9->occlusionFilterN)(&local_290);
            auVar66 = ZEXT3264(CONCAT428(0xff800000,
                                         CONCAT424(0xff800000,
                                                   CONCAT420(0xff800000,
                                                             CONCAT416(0xff800000,
                                                                       CONCAT412(0xff800000,
                                                                                 CONCAT48(0xff800000
                                                                                          ,
                                                  0xff800000ff800000)))))));
            auVar64 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar61 = ZEXT1664(ZEXT816(0) << 0x40);
            puVar37 = (undefined8 *)local_2c0._0_8_;
            uVar67 = local_2e0._0_4_;
          }
          auVar21._8_8_ = uStack_338;
          auVar21._0_8_ = local_340;
          auVar21 = vpcmpeqd_avx(auVar64._0_16_,auVar21);
          auVar20._8_8_ = uStack_328;
          auVar20._0_8_ = local_330;
          auVar20 = vpcmpeqd_avx(auVar64._0_16_,auVar20);
          auVar47._16_16_ = auVar20;
          auVar47._0_16_ = auVar21;
          auVar54 = local_300 & ~auVar47;
          if ((((((((auVar54 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar54 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar54 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar54 >> 0x7f,0) == '\0') &&
                (auVar54 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar54 >> 0xbf,0) == '\0') &&
              (auVar54 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar54[0x1f]) {
            auVar48._0_4_ = auVar21._0_4_ ^ local_300._0_4_;
            auVar48._4_4_ = auVar21._4_4_ ^ local_300._4_4_;
            auVar48._8_4_ = auVar21._8_4_ ^ local_300._8_4_;
            auVar48._12_4_ = auVar21._12_4_ ^ local_300._12_4_;
            auVar48._16_4_ = auVar20._0_4_ ^ local_300._16_4_;
            auVar48._20_4_ = auVar20._4_4_ ^ local_300._20_4_;
            auVar48._24_4_ = auVar20._8_4_ ^ local_300._24_4_;
            auVar48._28_4_ = auVar20._12_4_ ^ local_300._28_4_;
          }
          else {
            p_Var12 = context->args->filter;
            if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
              local_2c0._0_8_ = puVar37;
              local_2e0._0_4_ = uVar67;
              (*p_Var12)(&local_290);
              auVar66 = ZEXT3264(CONCAT428(0xff800000,
                                           CONCAT424(0xff800000,
                                                     CONCAT420(0xff800000,
                                                               CONCAT416(0xff800000,
                                                                         CONCAT412(0xff800000,
                                                                                   CONCAT48(
                                                  0xff800000,0xff800000ff800000)))))));
              auVar64 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar61 = ZEXT1664(ZEXT816(0) << 0x40);
              puVar37 = (undefined8 *)local_2c0._0_8_;
              uVar67 = local_2e0._0_4_;
            }
            auVar31._8_8_ = uStack_338;
            auVar31._0_8_ = local_340;
            auVar21 = vpcmpeqd_avx(auVar64._0_16_,auVar31);
            auVar32._8_8_ = uStack_328;
            auVar32._0_8_ = local_330;
            auVar20 = vpcmpeqd_avx(auVar64._0_16_,auVar32);
            auVar50._16_16_ = auVar20;
            auVar50._0_16_ = auVar21;
            auVar48._0_4_ = auVar21._0_4_ ^ local_300._0_4_;
            auVar48._4_4_ = auVar21._4_4_ ^ local_300._4_4_;
            auVar48._8_4_ = auVar21._8_4_ ^ local_300._8_4_;
            auVar48._12_4_ = auVar21._12_4_ ^ local_300._12_4_;
            auVar48._16_4_ = auVar20._0_4_ ^ local_300._16_4_;
            auVar48._20_4_ = auVar20._4_4_ ^ local_300._20_4_;
            auVar48._24_4_ = auVar20._8_4_ ^ local_300._24_4_;
            auVar48._28_4_ = auVar20._12_4_ ^ local_300._28_4_;
            auVar54 = vblendvps_avx(auVar66._0_32_,*(undefined1 (*) [32])(local_290.ray + 0x100),
                                    auVar50);
            *(undefined1 (*) [32])(local_290.ray + 0x100) = auVar54;
          }
          bVar29 = (auVar48 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
          bVar30 = (auVar48 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
          bVar28 = (auVar48 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
          bVar27 = SUB321(auVar48 >> 0x7f,0) == '\0';
          bVar26 = (auVar48 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
          bVar25 = SUB321(auVar48 >> 0xbf,0) == '\0';
          bVar24 = (auVar48 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
          bVar23 = -1 < auVar48[0x1f];
          bVar45 = ((((((bVar29 && bVar30) && bVar28) && bVar27) && bVar26) && bVar25) && bVar24) &&
                   bVar23;
          if (((((((bVar29 && bVar30) && bVar28) && bVar27) && bVar26) && bVar25) && bVar24) &&
              bVar23) {
            *(undefined4 *)(ray + k * 4 + 0x100) = uVar67;
            uVar43 = uVar43 ^ 1L << (uVar35 & 0x3f);
          }
        }
      } while ((bVar45 != false) && (uVar43 != 0));
      return (bool)(bVar45 ^ 1);
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(
          const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& Disc)
      {
        STAT3(shadow.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Vec3vf<M> n0;
        Disc.gather(v0, n0, geom);
        const vbool<M> valid = Disc.valid();
        return DiscIntersectorK<M, K>::intersect(
            valid, ray, k, context, geom, pre, v0, n0,
            Occluded1KEpilogM<M, K, filter>(ray, k, context, Disc.geomID(), Disc.primID()));
      }